

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O1

vw * VW::initialize(int argc,char **argv,io_buf *model,bool skipModelLoad,
                   trace_message_t trace_listener,void *trace_context)

{
  options_boost_po *this;
  vw *pvVar1;
  
  this = (options_boost_po *)operator_new(0x2e8);
  config::options_boost_po::options_boost_po(this,argc,argv);
  pvVar1 = initialize((options_i *)this,model,skipModelLoad,trace_listener,trace_context);
  pvVar1->should_delete_options = true;
  return pvVar1;
}

Assistant:

vw* initialize(
    int argc, char* argv[], io_buf* model, bool skipModelLoad, trace_message_t trace_listener, void* trace_context)
{
  options_i* options = new config::options_boost_po(argc, argv);
  vw* all = initialize(*options, model, skipModelLoad, trace_listener, trace_context);

  // When VW is deleted the options object will be cleaned up too.
  all->should_delete_options = true;
  return all;
}